

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O1

void __thiscall
pbrt::RealisticCamera::DrawRayPathFromScene
          (RealisticCamera *this,Ray *r,bool arrow,bool toOpticalIntercept)

{
  Float radius;
  uint uVar1;
  undefined8 uVar2;
  size_t sVar3;
  LensElementInterface *pLVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar10;
  int iVar11;
  undefined7 in_register_00000011;
  long lVar12;
  char *pcVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  Interval<float> i;
  Interval<float> i_00;
  Interval<float> i_01;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  Float t;
  Ray local_f8;
  undefined4 local_cc;
  Point3fi o;
  undefined1 local_a8 [16];
  float vb;
  Float va;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  local_cc = (undefined4)CONCAT71(in_register_00000011,arrow);
  sVar3 = (this->elementInterfaces).nStored;
  if (sVar3 == 0) {
    auVar16 = ZEXT816(0);
  }
  else {
    fVar33 = 0.0;
    lVar12 = 0;
    do {
      fVar33 = fVar33 + *(float *)((long)&((this->elementInterfaces).ptr)->thickness + lVar12);
      auVar16 = ZEXT416((uint)fVar33);
      lVar12 = lVar12 + 0x10;
    } while (sVar3 << 4 != lVar12);
  }
  if ((DrawRayPathFromScene(pbrt::Ray_const&,bool,bool)::LensFromCamera == '\0') &&
     (iVar11 = __cxa_guard_acquire(&DrawRayPathFromScene(pbrt::Ray_const&,bool,bool)::LensFromCamera
                                  ), iVar11 != 0)) {
    Scale(&DrawRayPathFromScene::LensFromCamera,1.0,1.0,-1.0);
    __cxa_guard_release(&DrawRayPathFromScene(pbrt::Ray_const&,bool,bool)::LensFromCamera);
  }
  fVar33 = (r->o).super_Tuple3<pbrt::Point3,_float>.x;
  auVar19._4_4_ = fVar33;
  auVar19._0_4_ = fVar33;
  auVar19._8_4_ = fVar33;
  auVar19._12_4_ = fVar33;
  fVar33 = (r->o).super_Tuple3<pbrt::Point3,_float>.y;
  auVar15._4_4_ = fVar33;
  auVar15._0_4_ = fVar33;
  auVar15._8_4_ = fVar33;
  auVar15._12_4_ = fVar33;
  auVar19 = vmovlhps_avx(auVar19,auVar15);
  fVar33 = (r->o).super_Tuple3<pbrt::Point3,_float>.z;
  auVar24._4_4_ = fVar33;
  auVar24._0_4_ = fVar33;
  auVar24._8_4_ = fVar33;
  auVar24._12_4_ = fVar33;
  local_f8.o.super_Tuple3<pbrt::Point3,_float>.x = auVar19._0_4_;
  local_f8.o.super_Tuple3<pbrt::Point3,_float>.y = auVar19._4_4_;
  local_f8.o.super_Tuple3<pbrt::Point3,_float>.z = auVar19._8_4_;
  local_f8.d.super_Tuple3<pbrt::Vector3,_float>.x = auVar19._12_4_;
  uVar2 = vmovlps_avx(auVar24);
  local_f8.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar2;
  local_f8.d.super_Tuple3<pbrt::Vector3,_float>.z = (float)((ulong)uVar2 >> 0x20);
  Transform::operator()(&o,&DrawRayPathFromScene::LensFromCamera,(Point3fi *)&local_f8);
  fVar33 = (r->d).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar18 = (r->d).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar38 = (r->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar18 * DrawRayPathFromScene::LensFromCamera.m.m[0][1]))
                            ,ZEXT416((uint)fVar33),
                            ZEXT416((uint)DrawRayPathFromScene::LensFromCamera.m.m[0][0]));
  auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)fVar38),
                            ZEXT416((uint)DrawRayPathFromScene::LensFromCamera.m.m[0][2]));
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar18 * DrawRayPathFromScene::LensFromCamera.m.m[1][1]))
                            ,ZEXT416((uint)fVar33),
                            ZEXT416((uint)DrawRayPathFromScene::LensFromCamera.m.m[1][0]));
  auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar38),
                            ZEXT416((uint)DrawRayPathFromScene::LensFromCamera.m.m[1][2]));
  auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar18 * DrawRayPathFromScene::LensFromCamera.m.m[2][1]))
                            ,ZEXT416((uint)fVar33),
                            ZEXT416((uint)DrawRayPathFromScene::LensFromCamera.m.m[2][0]));
  auVar24 = vfmadd231ss_fma(auVar24,ZEXT416((uint)fVar38),
                            ZEXT416((uint)DrawRayPathFromScene::LensFromCamera.m.m[2][2]));
  fVar33 = auVar24._0_4_;
  fVar18 = auVar15._0_4_;
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar18 * fVar18)),auVar19,auVar19);
  auVar6 = vfmadd231ss_fma(auVar6,auVar24,auVar24);
  auVar25._0_12_ = ZEXT812(0);
  auVar25._12_4_ = 0;
  if (0.0 < auVar6._0_4_) {
    auVar29._8_4_ = 0x7fffffff;
    auVar29._0_8_ = 0x7fffffff7fffffff;
    auVar29._12_4_ = 0x7fffffff;
    auVar5 = vandps_avx(auVar19,auVar29);
    auVar26 = vandps_avx(auVar15,auVar29);
    auVar24 = vandps_avx(auVar24,auVar29);
    auVar5 = vfmadd231ss_fma(ZEXT416((uint)(auVar26._0_4_ * 0.0)),auVar25,auVar5);
    auVar24 = vfmadd231ss_fma(auVar5,auVar25,auVar24);
    fVar17 = auVar24._0_4_ / auVar6._0_4_;
    fVar38 = auVar19._0_4_ * fVar17;
    local_78 = ZEXT416((uint)(fVar18 * fVar17));
    local_68 = ZEXT416((uint)(fVar33 * fVar17));
    i.high = fVar38;
    i.low = fVar38;
    local_58 = auVar15;
    local_48 = auVar19;
    auVar21._0_8_ = Interval<float>::operator+<float>((Interval<float> *)&o,i);
    auVar21._8_56_ = extraout_var;
    uVar2 = vmovlps_avx(auVar21._0_16_);
    o.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low
         = (float)uVar2;
    o.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high
         = (float)((ulong)uVar2 >> 0x20);
    i_00.high = (float)local_78._0_4_;
    i_00.low = (float)local_78._0_4_;
    auVar22._0_8_ =
         Interval<float>::operator+<float>
                   (&o.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y,i_00);
    auVar22._8_56_ = extraout_var_00;
    uVar2 = vmovlps_avx(auVar22._0_16_);
    o.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low
         = (float)uVar2;
    o.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high
         = (float)((ulong)uVar2 >> 0x20);
    i_01.high = (float)local_68._0_4_;
    i_01.low = (float)local_68._0_4_;
    auVar23._0_8_ =
         Interval<float>::operator+<float>
                   (&o.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z,i_01);
    auVar23._8_56_ = extraout_var_01;
    o.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z =
         (Interval<float>)vmovlps_avx(auVar23._0_16_);
    auVar19 = local_48;
    auVar15 = local_58;
  }
  auVar19 = vinsertps_avx(auVar19,auVar15,0x10);
  auVar5._4_4_ = o.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar5._0_4_ = o.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
  auVar5._8_4_ = o.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
  auVar5._12_4_ =
       o.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.
       high;
  local_f8.o.super_Tuple3<pbrt::Point3,_float>.z =
       (o.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.
        low + o.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
  local_f8.time = r->time;
  local_f8.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )(r->medium).
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  auVar15 = vinsertps_avx(auVar5,ZEXT416((uint)o.super_Point3<pbrt::Interval<float>_>.
                                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.
                                               high),0x10);
  auVar26._0_4_ =
       o.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.
       high + auVar15._0_4_;
  auVar26._4_4_ =
       o.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.
       low + auVar15._4_4_;
  auVar26._8_4_ = auVar15._8_4_ + 0.0;
  auVar26._12_4_ = auVar15._12_4_ + 0.0;
  auVar6._8_4_ = 0x3f000000;
  auVar6._0_8_ = 0x3f0000003f000000;
  auVar6._12_4_ = 0x3f000000;
  auVar15 = vmulps_avx512vl(auVar26,auVar6);
  uVar2 = vmovlps_avx(auVar15);
  local_f8.o.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar2;
  local_f8.o.super_Tuple3<pbrt::Point3,_float>.y = (float)((ulong)uVar2 >> 0x20);
  uVar2 = vmovlps_avx(auVar19);
  local_f8.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar2;
  local_f8.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar2 >> 0x20);
  local_f8.d.super_Tuple3<pbrt::Vector3,_float>.z = fVar33;
  if ((this->elementInterfaces).nStored != 0) {
    auVar7._8_4_ = 0x80000000;
    auVar7._0_8_ = 0x8000000080000000;
    auVar7._12_4_ = 0x80000000;
    local_a8 = vxorps_avx512vl(auVar16,auVar7);
    lVar12 = 0;
    uVar14 = 0;
    do {
      pLVar4 = (this->elementInterfaces).ptr;
      fVar33 = *(float *)((long)&pLVar4->curvatureRadius + lVar12);
      o.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.
      low = 0.0;
      o.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.
      high = 0.0;
      o.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.
      low = 0.0;
      if ((fVar33 != 0.0) || (NAN(fVar33))) {
        radius = *(Float *)((long)&pLVar4->curvatureRadius + lVar12);
        bVar10 = IntersectSphericalElement
                           (radius,radius + (float)local_a8._0_4_,&local_f8,&t,(Normal3f *)&o);
        if (bVar10) goto LAB_003e4d92;
LAB_003e5084:
        bVar10 = false;
      }
      else {
        auVar16._8_4_ = 0x80000000;
        auVar16._0_8_ = 0x8000000080000000;
        auVar16._12_4_ = 0x80000000;
        auVar16 = vxorps_avx512vl(ZEXT416((uint)(local_f8.o.super_Tuple3<pbrt::Point3,_float>.z -
                                                (float)local_a8._0_4_)),auVar16);
        t = auVar16._0_4_ / local_f8.d.super_Tuple3<pbrt::Vector3,_float>.z;
LAB_003e4d92:
        va = t;
        vb = 0.0;
        if (t < 0.0) {
          LogFatal<char_const(&)[2],char_const(&)[4],char_const(&)[2],float&,char_const(&)[4],float&>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cameras.cpp"
                     ,0x4a4,"Check failed: %s >= %s with %s = %s, %s = %s",(char (*) [2])0x462674,
                     (char (*) [4])"0.f",(char (*) [2])0x462674,&va,(char (*) [4])"0.f",&vb);
        }
        printf("Line[{{%f, %f}, {%f, %f}}],",(double)local_f8.o.super_Tuple3<pbrt::Point3,_float>.z,
               (double)local_f8.o.super_Tuple3<pbrt::Point3,_float>.x,
               (double)(local_f8.o.super_Tuple3<pbrt::Point3,_float>.z +
                       t * local_f8.d.super_Tuple3<pbrt::Vector3,_float>.z),
               (double)(local_f8.o.super_Tuple3<pbrt::Point3,_float>.x +
                       t * local_f8.d.super_Tuple3<pbrt::Vector3,_float>.x));
        auVar37._4_4_ = local_f8.d.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar37._0_4_ = local_f8.d.super_Tuple3<pbrt::Vector3,_float>.x;
        auVar37._8_8_ = 0;
        auVar27._0_4_ =
             t * local_f8.d.super_Tuple3<pbrt::Vector3,_float>.x +
             local_f8.o.super_Tuple3<pbrt::Point3,_float>.x;
        auVar27._4_4_ =
             t * local_f8.d.super_Tuple3<pbrt::Vector3,_float>.y +
             local_f8.o.super_Tuple3<pbrt::Point3,_float>.y;
        auVar27._8_4_ = t * 0.0 + 0.0;
        auVar27._12_4_ = t * 0.0 + 0.0;
        auVar30._0_4_ = auVar27._0_4_ * auVar27._0_4_;
        auVar30._4_4_ = auVar27._4_4_ * auVar27._4_4_;
        auVar30._8_4_ = auVar27._8_4_ * auVar27._8_4_;
        auVar30._12_4_ = auVar27._12_4_ * auVar27._12_4_;
        auVar16 = vmovshdup_avx(auVar30);
        auVar16 = vfmadd231ss_fma(auVar16,auVar27,auVar27);
        fVar18 = *(float *)((long)&pLVar4->apertureRadius + lVar12);
        if (auVar16._0_4_ <= fVar18 * fVar18) {
          auVar36._0_12_ = ZEXT812(0);
          auVar36._12_4_ = 0;
          local_f8.o.super_Tuple3<pbrt::Point3,_float>.z =
               t * local_f8.d.super_Tuple3<pbrt::Vector3,_float>.z +
               local_f8.o.super_Tuple3<pbrt::Point3,_float>.z;
          uVar2 = vmovlps_avx(auVar27);
          local_f8.o.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar2;
          local_f8.o.super_Tuple3<pbrt::Point3,_float>.y = (float)((ulong)uVar2 >> 0x20);
          if ((fVar33 != 0.0) || (NAN(fVar33))) {
            fVar33 = 1.0;
            if (uVar14 != 0) {
              fVar18 = *(float *)((long)(this->elementInterfaces).ptr + lVar12 + -8);
              if ((fVar18 != 0.0) || (fVar33 = 1.0, NAN(fVar18))) {
                fVar33 = fVar18;
              }
            }
            uVar1 = *(uint *)((long)&((this->elementInterfaces).ptr)->eta + lVar12);
            auVar16 = vfmadd231ss_fma(ZEXT416((uint)(local_f8.d.super_Tuple3<pbrt::Vector3,_float>.y
                                                    * local_f8.d.super_Tuple3<pbrt::Vector3,_float>.
                                                      y)),auVar37,auVar37);
            auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)local_f8.d.
                                                            super_Tuple3<pbrt::Vector3,_float>.z),
                                      ZEXT416((uint)local_f8.d.super_Tuple3<pbrt::Vector3,_float>.z)
                                     );
            if (auVar16._0_4_ < 0.0) {
              local_48._0_4_ = fVar33;
              local_58 = ZEXT416((uint)local_f8.d.super_Tuple3<pbrt::Vector3,_float>.y);
              local_68 = ZEXT416(uVar1);
              local_78 = ZEXT416((uint)local_f8.d.super_Tuple3<pbrt::Vector3,_float>.z);
              fVar18 = sqrtf(auVar16._0_4_);
              auVar36 = ZEXT816(0) << 0x40;
              auVar16 = local_78;
              auVar19 = local_58;
              auVar15 = local_68;
              fVar33 = (float)local_48._0_4_;
            }
            else {
              auVar16 = vsqrtss_avx(auVar16,auVar16);
              fVar18 = auVar16._0_4_;
              auVar16 = ZEXT416((uint)local_f8.d.super_Tuple3<pbrt::Vector3,_float>.z);
              auVar19 = ZEXT416((uint)local_f8.d.super_Tuple3<pbrt::Vector3,_float>.y);
              auVar15 = ZEXT416(uVar1);
            }
            uVar2 = vcmpss_avx512f(auVar15,auVar36,4);
            bVar10 = (bool)((byte)uVar2 & 1);
            auVar31._0_8_ = auVar16._0_8_ ^ 0x8000000080000000;
            auVar31._8_4_ = auVar16._8_4_ ^ 0x80000000;
            auVar31._12_4_ = auVar16._12_4_ ^ 0x80000000;
            auVar19 = vinsertps_avx(auVar37,auVar19,0x10);
            auVar32._0_8_ = auVar19._0_8_ ^ 0x8000000080000000;
            auVar32._8_4_ = auVar19._8_4_ ^ 0x80000000;
            auVar32._12_4_ = auVar19._12_4_ ^ 0x80000000;
            auVar34._4_4_ = fVar18;
            auVar34._0_4_ = fVar18;
            auVar34._8_4_ = fVar18;
            auVar34._12_4_ = fVar18;
            auVar19 = vdivps_avx(auVar32,auVar34);
            auVar24 = vmovshdup_avx(auVar19);
            auVar35._0_4_ = -auVar16._0_4_ / fVar18;
            auVar35._4_12_ = auVar31._4_12_;
            fVar33 = (float)((uint)bVar10 * auVar15._0_4_ + (uint)!bVar10 * 0x3f800000) / fVar33;
            auVar16 = vfmadd132ss_fma(auVar24,ZEXT416((uint)(auVar35._0_4_ *
                                                            o.super_Point3<pbrt::Interval<float>_>.
                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low)),
                                      ZEXT416((uint)o.super_Point3<pbrt::Interval<float>_>.
                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.high));
            auVar15 = vfmsub213ss_fma(ZEXT416((uint)o.super_Point3<pbrt::Interval<float>_>.
                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low),auVar35,
                                      ZEXT416((uint)(auVar35._0_4_ *
                                                    o.super_Point3<pbrt::Interval<float>_>.
                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low)));
            auVar15 = vfmadd231ss_fma(ZEXT416((uint)(auVar16._0_4_ + auVar15._0_4_)),auVar19,
                                      ZEXT416((uint)o.super_Point3<pbrt::Interval<float>_>.
                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.low));
            auVar16 = vfnmadd213ss_fma(auVar15,auVar15,SUB6416(ZEXT464(0x3f800000),0));
            fVar18 = 0.0;
            auVar16 = vmaxss_avx(auVar16,ZEXT816(0) << 0x20);
            fVar38 = auVar16._0_4_ / (fVar33 * fVar33);
            auVar16 = ZEXT816(0) << 0x20;
            if (fVar38 < 1.0) {
              auVar16 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar38)),auVar36);
              if (auVar16._0_4_ < 0.0) {
                local_68._0_4_ = fVar38;
                local_78._0_4_ = auVar15._0_4_;
                local_58 = auVar19;
                local_48 = ZEXT416((uint)fVar33);
                fVar18 = sqrtf(auVar16._0_4_);
                fVar33 = local_48._0_4_;
                auVar35 = ZEXT416((uint)auVar35._0_4_);
                auVar19 = local_58;
                fVar38 = (float)local_68._0_4_;
                fVar17 = (float)local_78._0_4_;
              }
              else {
                auVar16 = vsqrtss_avx(auVar16,auVar16);
                fVar18 = auVar16._0_4_;
                fVar17 = auVar15._0_4_;
              }
              fVar18 = fVar17 / fVar33 - fVar18;
              auVar28._4_4_ = fVar33;
              auVar28._0_4_ = fVar33;
              auVar28._8_4_ = fVar33;
              auVar28._12_4_ = fVar33;
              auVar16 = vdivps_avx(auVar19,auVar28);
              auVar20._0_4_ =
                   fVar18 * o.super_Point3<pbrt::Interval<float>_>.
                            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
              auVar20._4_4_ =
                   fVar18 * o.super_Point3<pbrt::Interval<float>_>.
                            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
              auVar20._8_4_ = fVar18 * 0.0;
              auVar20._12_4_ = fVar18 * 0.0;
              auVar16 = vsubps_avx(auVar20,auVar16);
              fVar18 = fVar18 * o.super_Point3<pbrt::Interval<float>_>.
                                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low -
                       auVar35._0_4_ / fVar33;
            }
            if (1.0 <= fVar38) goto LAB_003e5084;
            uVar2 = vmovlps_avx(auVar16);
            local_f8.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar2;
            local_f8.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar2 >> 0x20);
            local_f8.d.super_Tuple3<pbrt::Vector3,_float>.z = fVar18;
          }
          local_a8 = ZEXT416((uint)((float)local_a8._0_4_ +
                                   *(float *)((long)&pLVar4->thickness + lVar12)));
          bVar10 = true;
        }
        else {
          bVar10 = false;
        }
      }
      if (!bVar10) {
        return;
      }
      uVar14 = uVar14 + 1;
      lVar12 = lVar12 + 0x10;
    } while (uVar14 < (this->elementInterfaces).nStored);
  }
  if (toOpticalIntercept) {
    auVar8._8_4_ = 0x80000000;
    auVar8._0_8_ = 0x8000000080000000;
    auVar8._12_4_ = 0x80000000;
    auVar16 = vxorps_avx512vl(ZEXT416((uint)local_f8.o.super_Tuple3<pbrt::Point3,_float>.x),auVar8);
    fVar33 = auVar16._0_4_ / local_f8.d.super_Tuple3<pbrt::Vector3,_float>.x;
    printf("Point[{%f, %f}], ",
           (double)(local_f8.o.super_Tuple3<pbrt::Point3,_float>.z +
                   local_f8.d.super_Tuple3<pbrt::Vector3,_float>.z * fVar33),
           (double)(local_f8.o.super_Tuple3<pbrt::Point3,_float>.x +
                   local_f8.d.super_Tuple3<pbrt::Vector3,_float>.x * fVar33));
  }
  else {
    auVar9._8_4_ = 0x80000000;
    auVar9._0_8_ = 0x8000000080000000;
    auVar9._12_4_ = 0x80000000;
    auVar16 = vxorps_avx512vl(ZEXT416((uint)local_f8.o.super_Tuple3<pbrt::Point3,_float>.z),auVar9);
    fVar33 = auVar16._0_4_ / local_f8.d.super_Tuple3<pbrt::Vector3,_float>.z;
  }
  pcVar13 = "Line";
  if ((char)local_cc != '\0') {
    pcVar13 = "Arrow";
  }
  printf("%s[{{%f, %f}, {%f, %f}}]",(double)local_f8.o.super_Tuple3<pbrt::Point3,_float>.z,
         (double)local_f8.o.super_Tuple3<pbrt::Point3,_float>.x,
         (double)(local_f8.o.super_Tuple3<pbrt::Point3,_float>.z +
                 fVar33 * local_f8.d.super_Tuple3<pbrt::Vector3,_float>.z),
         (double)(local_f8.o.super_Tuple3<pbrt::Point3,_float>.x +
                 fVar33 * local_f8.d.super_Tuple3<pbrt::Vector3,_float>.x),pcVar13);
  return;
}

Assistant:

void RealisticCamera::DrawRayPathFromScene(const Ray &r, bool arrow,
                                           bool toOpticalIntercept) const {
    Float elementZ = LensFrontZ() * -1;

    // Transform _ray_ from camera to lens system space
    static const Transform LensFromCamera = Scale(1, 1, -1);
    Ray ray = LensFromCamera(r);
    for (size_t i = 0; i < elementInterfaces.size(); ++i) {
        const LensElementInterface &element = elementInterfaces[i];
        bool isStop = (element.curvatureRadius == 0);
        // Compute intersection of ray with lens element
        Float t;
        Normal3f n;
        if (isStop)
            t = -(ray.o.z - elementZ) / ray.d.z;
        else {
            Float radius = element.curvatureRadius;
            Float zCenter = elementZ + element.curvatureRadius;
            if (!IntersectSphericalElement(radius, zCenter, ray, &t, &n))
                return;
        }
        CHECK_GE(t, 0.f);

        printf("Line[{{%f, %f}, {%f, %f}}],", ray.o.z, ray.o.x, ray(t).z, ray(t).x);

        // Test intersection point against element aperture
        Point3f pHit = ray(t);
        Float r2 = pHit.x * pHit.x + pHit.y * pHit.y;
        Float apertureRadius2 = element.apertureRadius * element.apertureRadius;
        if (r2 > apertureRadius2)
            return;
        ray.o = pHit;

        // Update ray path for from-scene element interface interaction
        if (!isStop) {
            Vector3f wt;
            Float eta_i = (i == 0 || elementInterfaces[i - 1].eta == 0.f)
                              ? 1.f
                              : elementInterfaces[i - 1].eta;
            Float eta_t =
                (elementInterfaces[i].eta != 0.f) ? elementInterfaces[i].eta : 1.f;
            if (!Refract(Normalize(-ray.d), n, eta_t / eta_i, &wt))
                return;
            ray.d = wt;
        }
        elementZ += element.thickness;
    }

    // go to the film plane by default
    {
        Float ta = -ray.o.z / ray.d.z;
        if (toOpticalIntercept) {
            ta = -ray.o.x / ray.d.x;
            printf("Point[{%f, %f}], ", ray(ta).z, ray(ta).x);
        }
        printf("%s[{{%f, %f}, {%f, %f}}]", arrow ? "Arrow" : "Line", ray.o.z, ray.o.x,
               ray(ta).z, ray(ta).x);
    }
}